

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

void __thiscall
cmCPackGenerator::StoreOption<cmValue>(cmCPackGenerator *this,string *op,cmValue value)

{
  cmCPackLog *this_00;
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  char *local_1b8 [4];
  ostringstream cmCPackLog_msg;
  
  if (value.Value != (string *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    iVar1 = (**this->_vptr_cmCPackGenerator)(this);
    poVar2 = std::operator<<((ostream *)&cmCPackLog_msg,(char *)CONCAT44(extraout_var,iVar1));
    poVar2 = std::operator<<(poVar2,"::SetOption(");
    poVar2 = std::operator<<(poVar2,(string *)op);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = operator<<(poVar2,value);
    poVar2 = std::operator<<(poVar2,")");
    std::endl<char,std::char_traits<char>>(poVar2);
    this_00 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(this_00,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x3fe,local_1b8[0]);
    std::__cxx11::string::~string((string *)local_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    cmMakefile::AddDefinition(this->MakefileMap,op,value);
    return;
  }
  cmMakefile::RemoveDefinition(this->MakefileMap,op);
  return;
}

Assistant:

void cmCPackGenerator::StoreOption(const std::string& op, ValueType value)
{
  if (!value) {
    this->MakefileMap->RemoveDefinition(op);
    return;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                this->GetNameOfClass() << "::SetOption(" << op << ", " << value
                                       << ")" << std::endl);
  this->MakefileMap->AddDefinition(op, value);
}